

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  TestCaseTracker *this_00;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  ostringstream oss;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,(string *)sectionInfo);
  poVar4 = std::operator<<(poVar4,"@");
  operator<<(poVar4,&sectionInfo->lineInfo);
  this_00 = (this->m_testCaseTracker).nullableValue;
  std::__cxx11::stringbuf::str();
  bVar3 = SectionTracking::TestCaseTracker::enterSection(this_00,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (bVar3) {
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,&sectionInfo->lineInfo);
    pIVar1 = (this->m_reporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar1,sectionInfo);
    sVar2 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar2;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return bVar3;
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            if( !m_testCaseTracker->enterSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }